

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O2

ManagedDictionary *
duckdb_brotli::BrotliCreateManagedDictionary
          (brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  ManagedDictionary *pMVar1;
  
  pMVar1 = (ManagedDictionary *)BrotliBootstrapAlloc(0x28,alloc_func,free_func,opaque);
  if (pMVar1 != (ManagedDictionary *)0x0) {
    pMVar1->magic = 0xdebcede2;
    BrotliInitMemoryManager(&pMVar1->memory_manager_,alloc_func,free_func,opaque);
    pMVar1->dictionary = (uint32_t *)0x0;
  }
  return pMVar1;
}

Assistant:

ManagedDictionary* duckdb_brotli::BrotliCreateManagedDictionary(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  ManagedDictionary* result = (ManagedDictionary*)BrotliBootstrapAlloc(
      sizeof(ManagedDictionary), alloc_func, free_func, opaque);
  if (result == NULL) return NULL;

  result->magic = kManagedDictionaryMagic;
  BrotliInitMemoryManager(
      &result->memory_manager_, alloc_func, free_func, opaque);
  result->dictionary = NULL;

  return result;
}